

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int Test_SUNMatScaleAddI2(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  N_Vector in_RDX;
  N_Vector in_RSI;
  long *in_RDI;
  sunrealtype tol;
  N_Vector z;
  N_Vector w;
  SUNMatrix D;
  SUNMatrix C;
  SUNMatrix B;
  int failure;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar3 = SUNMatClone(in_RDI);
  uVar4 = N_VClone(in_RSI);
  uVar5 = N_VClone(in_RSI);
  uVar1 = SUNMatCopy(in_RDI,uVar3);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar3);
    if (uVar1 == 0) {
      uVar1 = SUNMatMatvec(uVar3,in_RSI,uVar4);
      if (uVar1 == 0) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RSI,in_RDX,uVar5);
        iVar2 = check_vector(in_RSI,in_RDX,(sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
        if (iVar2 == 0) {
          printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n");
          uVar6 = SUNMatClone(in_RDI);
          SUNSparseMatrix_Reallocate(uVar6,*(long *)(*in_RDI + 0x10) + *(long *)*in_RDI);
          uVar1 = SUNMatCopy(in_RDI,uVar6);
          if (uVar1 == 0) {
            uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar6);
            if (uVar1 == 0) {
              uVar1 = SUNMatMatvec(uVar6,in_RSI,uVar4);
              if (uVar1 == 0) {
                N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RSI,in_RDX,uVar5);
                iVar2 = check_vector(in_RSI,in_RDX,
                                     (sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
                if (iVar2 == 0) {
                  printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n");
                  uVar7 = SUNMatClone(uVar6);
                  uVar1 = SUNMatCopy(uVar6,uVar7);
                  if (uVar1 == 0) {
                    uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar7);
                    if (uVar1 == 0) {
                      uVar1 = SUNMatMatvec(uVar7,in_RSI,uVar4);
                      if (uVar1 == 0) {
                        iVar2 = check_vector(in_RSI,in_RDX,
                                             (sunrealtype)(ulong)in_stack_ffffffffffffffd8);
                        if (iVar2 == 0) {
                          printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n");
                          SUNMatDestroy(uVar3);
                          SUNMatDestroy(uVar6);
                          SUNMatDestroy(uVar7);
                          N_VDestroy(uVar4);
                          N_VDestroy(uVar5);
                          local_4 = 0;
                        }
                        else {
                          printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
                          printf("\nA =\n");
                          SUNSparseMatrix_Print(in_RDI,_stdout);
                          printf("\nD =\n");
                          SUNSparseMatrix_Print(uVar7,_stdout);
                          printf("\nz =\n");
                          N_VPrint_Serial(uVar4);
                          printf("\ny =\n");
                          N_VPrint_Serial(in_RDX);
                          SUNMatDestroy(uVar3);
                          SUNMatDestroy(uVar6);
                          SUNMatDestroy(uVar7);
                          N_VDestroy(uVar4);
                          N_VDestroy(uVar5);
                          local_4 = 1;
                        }
                      }
                      else {
                        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                        SUNMatDestroy(uVar3);
                        SUNMatDestroy(uVar6);
                        SUNMatDestroy(uVar7);
                        N_VDestroy(uVar4);
                        N_VDestroy(uVar5);
                        local_4 = 1;
                      }
                    }
                    else {
                      printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
                      SUNMatDestroy(uVar3);
                      SUNMatDestroy(uVar6);
                      SUNMatDestroy(uVar7);
                      N_VDestroy(uVar4);
                      N_VDestroy(uVar5);
                      local_4 = 1;
                    }
                  }
                  else {
                    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
                    SUNMatDestroy(uVar3);
                    SUNMatDestroy(uVar6);
                    SUNMatDestroy(uVar7);
                    N_VDestroy(uVar4);
                    N_VDestroy(uVar5);
                    local_4 = 1;
                  }
                }
                else {
                  printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
                  printf("\nA =\n");
                  SUNSparseMatrix_Print(in_RDI,_stdout);
                  printf("\nC =\n");
                  SUNSparseMatrix_Print(uVar6,_stdout);
                  printf("\nz =\n");
                  N_VPrint_Serial(uVar4);
                  printf("\nw =\n");
                  N_VPrint_Serial(uVar5);
                  SUNMatDestroy(uVar3);
                  SUNMatDestroy(uVar6);
                  N_VDestroy(uVar4);
                  N_VDestroy(uVar5);
                  local_4 = 1;
                }
              }
              else {
                printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                SUNMatDestroy(uVar3);
                SUNMatDestroy(uVar6);
                N_VDestroy(uVar4);
                N_VDestroy(uVar5);
                local_4 = 1;
              }
            }
            else {
              printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
              SUNMatDestroy(uVar3);
              SUNMatDestroy(uVar6);
              N_VDestroy(uVar4);
              N_VDestroy(uVar5);
              local_4 = 1;
            }
          }
          else {
            printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            SUNMatDestroy(uVar3);
            SUNMatDestroy(uVar6);
            N_VDestroy(uVar4);
            N_VDestroy(uVar5);
            local_4 = 1;
          }
        }
        else {
          printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
          printf("\nA =\n");
          SUNSparseMatrix_Print(in_RDI,_stdout);
          printf("\nB =\n");
          SUNSparseMatrix_Print(uVar3,_stdout);
          printf("\nz =\n");
          N_VPrint_Serial(uVar4);
          printf("\nw =\n");
          N_VPrint_Serial(uVar5);
          SUNMatDestroy(uVar3);
          N_VDestroy(uVar4);
          N_VDestroy(uVar5);
          local_4 = 1;
        }
      }
      else {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
        SUNMatDestroy(uVar3);
        N_VDestroy(uVar4);
        N_VDestroy(uVar5);
        local_4 = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
      SUNMatDestroy(uVar3);
      N_VDestroy(uVar4);
      N_VDestroy(uVar5);
      local_4 = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    SUNMatDestroy(uVar3);
    N_VDestroy(uVar4);
    N_VDestroy(uVar5);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatScaleAddI2(SUNMatrix A, N_Vector x, N_Vector y)
{
  int failure;
  SUNMatrix B, C, D;
  N_Vector w, z;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  /* create clones for test */
  B = SUNMatClone(A);
  z = N_VClone(x);
  w = N_VClone(x);

  /* test 1: add I to a matrix with insufficient storage */
  failure = SUNMatCopy(A, B);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, B); /* B = I-A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(B, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  N_VLinearSum(ONE, x, NEG_ONE, y, w); /* B x = (I - A) x = x - Ax = x - y = w */
  failure = check_vector(z, w, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n"); }

  /* test 2: add I to a matrix with sufficient but misplaced
     storage */
  C       = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(C, SM_NNZ_S(A) + SM_ROWS_S(A));
  failure = SUNMatCopy(A, C);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, C); /* C = I-A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(C, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  N_VLinearSum(ONE, x, NEG_ONE, y, w);
  failure = check_vector(z, w, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n"); }

  /* test 3: add I to a matrix with appropriate structure already in place */
  D       = SUNMatClone(C);
  failure = SUNMatCopy(C, D);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, D); /* D = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(D, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = check_vector(z, y, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n"); }

  SUNMatDestroy(B);
  SUNMatDestroy(C);
  SUNMatDestroy(D);
  N_VDestroy(z);
  N_VDestroy(w);
  return (0);
}